

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_xinput2.c
# Opt level: O2

int dequeue_event(ManyMouseEvent *event)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  
  bVar5 = input_events_read != input_events_write;
  if (bVar5) {
    lVar4 = (long)input_events_read;
    iVar1 = input_events[lVar4].maxval;
    event->minval = input_events[lVar4].minval;
    event->maxval = iVar1;
    uVar2 = input_events[lVar4].device;
    uVar3 = input_events[lVar4].item;
    iVar1 = input_events[lVar4].value;
    event->type = input_events[lVar4].type;
    event->device = uVar2;
    event->item = uVar3;
    event->value = iVar1;
    input_events_read = (input_events_read + 1) % 0x400;
  }
  return (uint)bVar5;
}

Assistant:

static int dequeue_event(ManyMouseEvent *event)
{
    if (input_events_read != input_events_write)  /* no events if equal. */
    {
        memcpy(event, &input_events[input_events_read], sizeof (*event));
        input_events_read = ((input_events_read + 1) % MAX_EVENTS);
        return 1;
    } /* if */
    return 0;  /* no event. */
}